

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfDeepTiledOutputFile.cpp
# Opt level: O0

TileCoord __thiscall Imf_2_5::DeepTiledOutputFile::Data::nextTileCoord(Data *this,TileCoord *a)

{
  uint uVar1;
  TileCoord TVar2;
  LogicExc *pLVar3;
  ArgExc *this_00;
  undefined8 *in_RSI;
  long in_RDI;
  stringstream _iex_throw_s;
  TileCoord b;
  stringstream local_1a8 [16];
  ostream local_198 [392];
  int local_10;
  int iStack_c;
  int local_8;
  int iStack_4;
  
  local_10 = (int)*in_RSI;
  iStack_c = (int)((ulong)*in_RSI >> 0x20);
  local_8 = (int)in_RSI[1];
  iStack_4 = (int)((ulong)in_RSI[1] >> 0x20);
  if (*(int *)(in_RDI + 0xc0) == 0) {
    local_10 = local_10 + 1;
    if (*(int *)(*(long *)(in_RDI + 0xe0) + (long)local_8 * 4) <= local_10) {
      local_10 = 0;
      iStack_c = iStack_c + 1;
      if (*(int *)(*(long *)(in_RDI + 0xe8) + (long)iStack_4 * 4) <= iStack_c) {
        iStack_c = 0;
        uVar1 = *(uint *)(in_RDI + 0x48);
        if (uVar1 < 2) {
          local_8 = local_8 + 1;
          iStack_4 = iStack_4 + 1;
        }
        else if (uVar1 == 2) {
          local_8 = local_8 + 1;
          if (*(int *)(in_RDI + 0xd4) <= local_8) {
            local_8 = 0;
            iStack_4 = iStack_4 + 1;
          }
        }
        else if (uVar1 == 3) {
          pLVar3 = (LogicExc *)__cxa_allocate_exception(0x48);
          Iex_2_5::LogicExc::LogicExc(pLVar3,"unknown level mode computing nextTileCoord");
          __cxa_throw(pLVar3,&Iex_2_5::LogicExc::typeinfo,Iex_2_5::LogicExc::~LogicExc);
        }
      }
    }
  }
  else if (*(int *)(in_RDI + 0xc0) == 1) {
    local_10 = local_10 + 1;
    if (*(int *)(*(long *)(in_RDI + 0xe0) + (long)local_8 * 4) <= local_10) {
      local_10 = 0;
      iStack_c = iStack_c + -1;
      if (iStack_c < 0) {
        uVar1 = *(uint *)(in_RDI + 0x48);
        if (uVar1 < 2) {
          local_8 = local_8 + 1;
          iStack_4 = iStack_4 + 1;
        }
        else if (uVar1 == 2) {
          local_8 = local_8 + 1;
          if (*(int *)(in_RDI + 0xd4) <= local_8) {
            local_8 = 0;
            iStack_4 = iStack_4 + 1;
          }
        }
        else if (uVar1 == 3) {
          pLVar3 = (LogicExc *)__cxa_allocate_exception(0x48);
          Iex_2_5::LogicExc::LogicExc(pLVar3,"unknown level mode computing nextTileCoord");
          __cxa_throw(pLVar3,&Iex_2_5::LogicExc::typeinfo,Iex_2_5::LogicExc::~LogicExc);
        }
        if (iStack_4 < *(int *)(in_RDI + 0xd8)) {
          iStack_c = *(int *)(*(long *)(in_RDI + 0xe8) + (long)iStack_4 * 4) + -1;
        }
      }
    }
  }
  else if (*(int *)(in_RDI + 0xc0) == 2) {
    iex_debugTrap();
    std::__cxx11::stringstream::stringstream(local_1a8);
    std::operator<<(local_198,
                    "can\'t compute next tile from randomly ordered image: use getTilesInOrder instead"
                   );
    this_00 = (ArgExc *)__cxa_allocate_exception(0x48);
    Iex_2_5::ArgExc::ArgExc(this_00,local_1a8);
    __cxa_throw(this_00,&Iex_2_5::ArgExc::typeinfo,Iex_2_5::ArgExc::~ArgExc);
  }
  TVar2.dy = iStack_c;
  TVar2.dx = local_10;
  TVar2.lx = local_8;
  TVar2.ly = iStack_4;
  return TVar2;
}

Assistant:

TileCoord
DeepTiledOutputFile::Data::nextTileCoord (const TileCoord &a)
{
    TileCoord b = a;

    if (lineOrder == INCREASING_Y)
    {
        b.dx++;

        if (b.dx >= numXTiles[b.lx])
        {
            b.dx = 0;
            b.dy++;

            if (b.dy >= numYTiles[b.ly])
            {
                //
                // the next tile is in the next level
                //

                b.dy = 0;

                switch (tileDesc.mode)
                {
                  case ONE_LEVEL:
                  case MIPMAP_LEVELS:

                    b.lx++;
                    b.ly++;
                    break;

                  case RIPMAP_LEVELS:

                    b.lx++;

                    if (b.lx >= numXLevels)
                    {
                        b.lx = 0;
                        b.ly++;

                        #ifdef DEBUG
                            assert (b.ly <= numYLevels);
                        #endif
                    }
                    break;
                  case NUM_LEVELMODES :
                      throw IEX_NAMESPACE::LogicExc("unknown level mode computing nextTileCoord");
                }
            }
        }
    }
    else if (lineOrder == DECREASING_Y)
    {
        b.dx++;

        if (b.dx >= numXTiles[b.lx])
        {
            b.dx = 0;
            b.dy--;

            if (b.dy < 0)
            {
                //
                // the next tile is in the next level
                //

                switch (tileDesc.mode)
                {
                  case ONE_LEVEL:
                  case MIPMAP_LEVELS:

                    b.lx++;
                    b.ly++;
                    break;

                  case RIPMAP_LEVELS:

                    b.lx++;

                    if (b.lx >= numXLevels)
                    {
                        b.lx = 0;
                        b.ly++;

                        #ifdef DEBUG
                            assert (b.ly <= numYLevels);
                        #endif
                    }
                    break;
                  case NUM_LEVELMODES :
                      throw IEX_NAMESPACE::LogicExc("unknown level mode computing nextTileCoord");
                }

                if (b.ly < numYLevels)
                    b.dy = numYTiles[b.ly] - 1;
            }
        }
    }else if(lineOrder==RANDOM_Y)
    {                 
        THROW (IEX_NAMESPACE::ArgExc,
              "can't compute next tile from randomly ordered image: use getTilesInOrder instead");
        
    }

    return b;
}